

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
VanSimulationDataGenerator::VanSimulationDataGenerator(VanSimulationDataGenerator *this)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)&this->mSerialText,"My first analyzer, woo hoo!",&local_11)
  ;
  this->mStringIndex = 0;
  SimulationChannelDescriptor::SimulationChannelDescriptor(&this->mSerialSimulationData);
  return;
}

Assistant:

VanSimulationDataGenerator::VanSimulationDataGenerator()
:	mSerialText( "My first analyzer, woo hoo!" ),
    mStringIndex( 0 )
{
}